

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

void kj::_::anon_unknown_0::RemovePlus(char *buffer)

{
  size_t sVar1;
  char *local_10;
  char *buffer_local;
  
  local_10 = buffer;
  while( true ) {
    local_10 = strchr(local_10,0x2b);
    if (local_10 == (char *)0x0) break;
    sVar1 = strlen(local_10 + 1);
    memmove(local_10,local_10 + 1,sVar1 + 1);
  }
  return;
}

Assistant:

void RemovePlus(char* buffer) {
  // Remove any + characters because they are redundant and ugly.

  for (;;) {
    buffer = strchr(buffer, '+');
    if (buffer == NULL) {
      return;
    }
    memmove(buffer, buffer + 1, strlen(buffer + 1) + 1);
  }
}